

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall CP::vector<int>::expand(vector<int> *this,size_t capacity)

{
  int *piVar1;
  int *__s;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  
  uVar2 = -(ulong)(capacity >> 0x3e != 0) | capacity * 4;
  __s = (int *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  piVar1 = this->mData;
  uVar2 = this->mSize;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    __s[uVar3] = piVar1[uVar3];
  }
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  this->mData = __s;
  this->mCap = capacity;
  return;
}

Assistant:

void expand(size_t capacity) {
      T *arr = new T[capacity]();
      for (size_t i = 0;i < mSize;i++) {
        arr[i] = mData[i];
      }
      delete [] mData;
      mData = arr;
      mCap = capacity;
    }